

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

yoml_t * resolve_tag(char *tag,yoml_t *node,void *cb_arg)

{
  size_t *psVar1;
  char *__s1;
  yoml_t *pyVar2;
  long lVar3;
  int iVar4;
  ulong new_capacity;
  long lVar5;
  long *plVar6;
  h2o_iovec_t hVar7;
  yoml_parse_args_t local_50;
  
  iVar4 = strcmp(tag,"!file");
  if (iVar4 == 0) {
    if (node->type != YOML_TYPE_SCALAR) {
      resolve_tag_cold_1();
      return (yoml_t *)0x0;
    }
    __s1 = (node->data).scalar;
    lVar5 = *(long *)((long)cb_arg + 8);
    if (lVar5 != 0) {
      plVar6 = (long *)(*cb_arg + 0x10);
      do {
        iVar4 = strcmp(__s1,(char *)plVar6[-2]);
        if (iVar4 == 0) {
          pyVar2 = (yoml_t *)*plVar6;
          psVar1 = &pyVar2->_refcnt;
          *psVar1 = *psVar1 + 1;
          return pyVar2;
        }
        plVar6 = plVar6 + 3;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    local_50.mem_set = (_func_void_ptr_void_ptr_int_size_t *)0x0;
    local_50.resolve_tag.cb = resolve_tag;
    local_50.filename = __s1;
    local_50.resolve_tag.cb_arg = cb_arg;
    node = load_config(&local_50,node);
    if (node == (yoml_t *)0x0) {
      return (yoml_t *)0x0;
    }
    new_capacity = *(long *)((long)cb_arg + 8) + 1;
    if (*(ulong *)((long)cb_arg + 0x10) < new_capacity) {
      h2o_vector__expand((h2o_mem_pool_t *)0x0,(h2o_vector_t *)cb_arg,0x18,new_capacity);
    }
    hVar7 = h2o_strdup((h2o_mem_pool_t *)0x0,__s1,0xffffffffffffffff);
    lVar5 = *cb_arg;
    lVar3 = *(long *)((long)cb_arg + 8);
    *(long *)((long)cb_arg + 8) = lVar3 + 1;
    *(char **)(lVar5 + lVar3 * 0x18) = hVar7.base;
    *(size_t *)(lVar5 + 8 + lVar3 * 0x18) = hVar7.len;
    *(yoml_t **)(lVar5 + 0x10 + lVar3 * 0x18) = node;
  }
  node->_refcnt = node->_refcnt + 1;
  return node;
}

Assistant:

static yoml_t *resolve_tag(const char *tag, yoml_t *node, void *cb_arg)
{
    resolve_tag_arg_t *arg = (resolve_tag_arg_t *)cb_arg;

    if (strcmp(tag, "!file") == 0) {
        return resolve_file_tag(node, arg);
    }

    /* otherwise, return the node itself */
    ++node->_refcnt;
    return node;
}